

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O0

int dwarf_get_debug_str_index(Dwarf_Attribute attr,Dwarf_Unsigned *return_index,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  Dwarf_Small *pDVar2;
  Dwarf_Unsigned sectionlen;
  Dwarf_Unsigned length_size;
  int indxres;
  Dwarf_Small *info_ptr;
  Dwarf_Unsigned index;
  Dwarf_Byte_Ptr section_end;
  Dwarf_Debug pDStack_40;
  int res;
  Dwarf_Debug dbg;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Error *ppDStack_28;
  int theform;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *return_index_local;
  Dwarf_Attribute attr_local;
  
  cu_context._4_4_ = (uint)attr->ar_attribute_form;
  dbg = (Dwarf_Debug)0x0;
  pDStack_40 = (Dwarf_Debug)0x0;
  section_end._4_4_ = 0;
  index = 0;
  info_ptr = (Dwarf_Small *)0x0;
  ppDStack_28 = error;
  error_local = (Dwarf_Error *)return_index;
  return_index_local = (Dwarf_Unsigned *)attr;
  section_end._4_4_ =
       get_attr_dbg(&stack0xffffffffffffffc0,(Dwarf_CU_Context_conflict *)&dbg,attr,error);
  attr_local._4_4_ = section_end._4_4_;
  if (section_end._4_4_ == 0) {
    index = (Dwarf_Unsigned)_dwarf_calculate_info_section_end_ptr((Dwarf_CU_Context_conflict)dbg);
    attr_local._4_4_ =
         dw_read_str_index_val_itself
                   (pDStack_40,cu_context._4_4_,(Dwarf_Small *)return_index_local[2],
                    (Dwarf_Small *)index,(Dwarf_Unsigned *)&info_ptr,ppDStack_28);
    if (attr_local._4_4_ == 0) {
      *error_local = (Dwarf_Error)info_ptr;
    }
    else {
      pDVar1 = (Dwarf_Small *)(pDStack_40->de_debug_str_offsets).dss_size;
      if ((pDVar1 < info_ptr) ||
         (pDVar2 = (Dwarf_Small *)((long)info_ptr * (ulong)*(byte *)&dbg->de_errhand),
         pDVar1 <= pDVar2 && (long)pDVar2 - (long)pDVar1 != 0)) {
        _dwarf_error_string(pDStack_40,ppDStack_28,0x74,
                            "DW_DLE_ATTR_FORM_SIZE_BAD: An Attribute Value (index  into .debug_str_offsets) is Impossibly large. Corrupt Dwarf."
                           );
        attr_local._4_4_ = 1;
      }
    }
  }
  return attr_local._4_4_;
}

Assistant:

int
dwarf_get_debug_str_index(Dwarf_Attribute attr,
    Dwarf_Unsigned *return_index,
    Dwarf_Error *error)
{
    int theform = attr->ar_attribute_form;
    Dwarf_CU_Context cu_context = 0;
    Dwarf_Debug dbg = 0;
    int res  = 0;
    Dwarf_Byte_Ptr section_end =  0;
    Dwarf_Unsigned index = 0;
    Dwarf_Small *info_ptr = 0;
    int indxres = 0;
    Dwarf_Unsigned length_size = 0;
    Dwarf_Unsigned sectionlen = 0;

    res = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    section_end =
        _dwarf_calculate_info_section_end_ptr(cu_context);
    info_ptr = attr->ar_debug_ptr;

    indxres = dw_read_str_index_val_itself(dbg, theform, info_ptr,
        section_end, &index,error);
    if (indxres == DW_DLV_OK) {
        *return_index = index;
        return indxres;
    }
    length_size = cu_context->cc_length_size;
    sectionlen = dbg->de_debug_str_offsets.dss_size;
    if (index > sectionlen ||
        (index *length_size) > sectionlen) {
        _dwarf_error_string(dbg, error,
            DW_DLE_ATTR_FORM_SIZE_BAD,
            "DW_DLE_ATTR_FORM_SIZE_BAD: "
            "An Attribute Value (index  into "
            ".debug_str_offsets) is Impossibly "
            "large. Corrupt Dwarf.");
        return DW_DLV_ERROR;
    }
    return indxres;
}